

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::HttpOutputStream::finishBody(HttpOutputStream *this)

{
  char (*in_RCX) [65];
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_1c8;
  Array<char> local_1c0;
  Exception local_1a8;
  
  local_1a8.ownFile.content.ptr = &this->inBody;
  if (this->inBody == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x91a,FAILED,"inBody","_kjCondition,",(DebugExpression<bool_&> *)&local_1a8);
    kj::_::Debug::Fault::~Fault(&local_1c8);
  }
  else {
    this->inBody = false;
    if (this->writeInProgress == true) {
      this->broken = true;
      kj::_::Debug::makeDescription<char_const(&)[65]>
                ((String *)&local_1c0,(Debug *)0x43cb5d,
                 "previous HTTP message body incomplete; can\'t write more messages",in_RCX);
      Exception::Exception
                (&local_1a8,FAILED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x924,(String *)&local_1c0);
      Promise<void>::Promise((Promise<void> *)&local_1c8,&local_1a8);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->writeQueue,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c8);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c8);
      Exception::~Exception(&local_1a8);
      Array<char>::~Array(&local_1c0);
    }
  }
  return;
}

Assistant:

void finishBody() {
    // Called when entire body was written.

    KJ_REQUIRE(inBody) { return; }
    inBody = false;

    if (writeInProgress) {
      // It looks like the last write never completed -- possibly because it was canceled or threw
      // an exception. We must treat this equivalent to abortBody().
      broken = true;

      // Cancel any writes that are still queued.
      writeQueue = KJ_EXCEPTION(FAILED,
          "previous HTTP message body incomplete; can't write more messages");
    }
  }